

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laser_tag.cpp
# Opt level: O3

double __thiscall despot::LaserTag::LaserRange(LaserTag *this,State *state,int dir)

{
  int iVar1;
  int iVar2;
  char cVar3;
  uint uVar4;
  int *piVar5;
  int iVar6;
  Coord coord;
  Coord opp;
  Coord rob;
  undefined8 local_50;
  ulong local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  iVar6 = (int)this + 0x58;
  local_38 = despot::Floor::GetCell(iVar6);
  local_40 = despot::Floor::GetCell(iVar6);
  iVar6 = 1;
  while( true ) {
    local_50 = despot::Coord::operator*((Coord *)(&Compass::DIRECTIONS + dir),iVar6);
    local_48 = despot::operator+((Coord *)&local_38,(Coord *)&local_50);
    piVar5 = (int *)&Floor::INVALID;
    uVar4 = (uint)local_48;
    if (((-1 < (int)uVar4) && (piVar5 = (int *)&Floor::INVALID, -1 < (long)local_48)) &&
       (piVar5 = (int *)&Floor::INVALID, (int)uVar4 < (this->super_BaseTag).floor_.num_cols_)) {
      piVar5 = (int *)&Floor::INVALID;
      if ((int)(local_48 >> 0x20) < (this->super_BaseTag).floor_.num_rows_) {
        piVar5 = (this->super_BaseTag).floor_.floor_[local_48 >> 0x20] + (uVar4 & 0x7fffffff);
      }
    }
    if (*piVar5 == -1) break;
    cVar3 = despot::operator==((Coord *)&local_48,(Coord *)&local_40);
    if (cVar3 != '\0') break;
    iVar6 = iVar6 + 1;
  }
  iVar1 = *(int *)(&Compass::DIRECTIONS + dir);
  iVar2 = *(int *)((long)&Compass::DIRECTIONS + (long)dir * 8 + 4);
  return SQRT((double)(iVar2 * iVar2 + iVar1 * iVar1)) * (double)iVar6;
}

Assistant:

double LaserTag::LaserRange(const State& state, int dir) const {
	Coord rob = floor_.GetCell(rob_[state.state_id]), opp = floor_.GetCell(
		opp_[state.state_id]);
	int d = 1;
	while (true) {
		Coord coord = rob + Compass::DIRECTIONS[dir] * d;
		if (floor_.GetIndex(coord) == -1 || coord == opp)
			break;
		d++;
	}
	int x = Compass::DIRECTIONS[dir].x, y = Compass::DIRECTIONS[dir].y;

	return d * sqrt(x * x + y * y);
}